

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

ImGuiOldColumns * ImGui::FindOrCreateColumns(ImGuiWindow *window,ImGuiID id)

{
  uint uVar1;
  long lVar2;
  ImGuiOldColumns *pIVar3;
  ulong uVar4;
  long lVar5;
  ImGuiOldColumns IStack_a8;
  
  uVar1 = (window->ColumnsStorage).Size;
  uVar4 = 0;
  if (0 < (int)uVar1) {
    uVar4 = (ulong)uVar1;
  }
  lVar2 = -0x88;
  do {
    lVar5 = lVar2;
    if (uVar4 * 0x88 - (lVar5 + 0x88) == 0) {
      memset(&IStack_a8,0,0x88);
      ImVector<ImGuiOldColumns>::push_back(&window->ColumnsStorage,&IStack_a8);
      ImGuiOldColumns::~ImGuiOldColumns(&IStack_a8);
      pIVar3 = (window->ColumnsStorage).Data + (long)(window->ColumnsStorage).Size + -1;
      pIVar3->ID = id;
      return pIVar3;
    }
    pIVar3 = (window->ColumnsStorage).Data;
    lVar2 = lVar5 + 0x88;
  } while (*(ImGuiID *)((long)&pIVar3[1].ID + lVar5) != id);
  return (ImGuiOldColumns *)((long)&pIVar3[1].ID + lVar5);
}

Assistant:

ImGuiOldColumns* ImGui::FindOrCreateColumns(ImGuiWindow* window, ImGuiID id)
{
    // We have few columns per window so for now we don't need bother much with turning this into a faster lookup.
    for (int n = 0; n < window->ColumnsStorage.Size; n++)
        if (window->ColumnsStorage[n].ID == id)
            return &window->ColumnsStorage[n];

    window->ColumnsStorage.push_back(ImGuiOldColumns());
    ImGuiOldColumns* columns = &window->ColumnsStorage.back();
    columns->ID = id;
    return columns;
}